

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall UDPSocket::setMTUDiscovery(UDPSocket *this,IP_PMTUDISC_ENUM e)

{
  int iVar1;
  string *__return_storage_ptr__;
  undefined4 local_18;
  uint l;
  uint v;
  IP_PMTUDISC_ENUM e_local;
  UDPSocket *this_local;
  
  switch(e) {
  case WANT:
    local_18 = 1;
    break;
  case DONT:
    local_18 = 0;
    break;
  case DO:
    local_18 = 2;
    break;
  case PROBE:
    local_18 = 3;
  }
  l = e;
  _v = this;
  iVar1 = setsockopt((this->super_Socket).sockfd,0,10,&local_18,4);
  if (-1 < iVar1) {
    return;
  }
  __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
  sock_error_string_abi_cxx11_(__return_storage_ptr__,"UDPSocket::setMTUDiscovery()");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void UDPSocket::setMTUDiscovery(enum IP_PMTUDISC_ENUM e) {
  unsigned int v;
  unsigned int l = sizeof(v);
  switch (e) {
  case WANT:
#ifdef _WIN32
    return;
#else
    v = IP_PMTUDISC_WANT;
    break;
#endif
  case DONT:
    v = IP_PMTUDISC_DONT;
    break;
  case DO:
    v = IP_PMTUDISC_DO;
    break;
  case PROBE:
    v = IP_PMTUDISC_PROBE;
  }
  if (setsockopt(sockfd, IPPROTO_IP, IP_MTU_DISCOVER, (char *)&v, l) < 0) {
    throw sock_error_string("UDPSocket::setMTUDiscovery()");
  }
}